

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
* cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::find_word_endings
            (vector<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,Iterator first,Iterator last)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  Iterator it;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = false;
  bVar2 = false;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    bVar4 = *first._M_current + 0xbf;
    bVar1 = SimpleStringTraits::is_alphanumeric(*first._M_current);
    if ((bVar2 != false) && ((bVar1 & (bVar3 | 0x19 < bVar4)) == 0)) {
      local_38._M_current = first._M_current + -1;
      std::
      vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,std::allocator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
      ::
      emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                ((vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,std::allocator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
                  *)__return_storage_ptr__,&local_38);
    }
    bVar3 = bVar4 < 0x1a;
    bVar2 = bVar1;
  }
  if (bVar2 != false) {
    local_38._M_current = last._M_current + -1;
    std::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,std::allocator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
    ::emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((vector<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,std::allocator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
                *)__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Iterator> find_word_endings(Iterator const first,
                                                 Iterator const last) {
    std::vector<Iterator> word_ends;
    bool prev_uppercase = false;
    bool prev_alphanumeric = false;
    for (auto it = first; it != last; ++it) {
      auto const c = *it;
      bool const next_uppercase = StringTraits::is_uppercase(c);
      bool const next_alphanumeric = StringTraits::is_alphanumeric(c);
      if (prev_alphanumeric &&
          (!next_alphanumeric || (!prev_uppercase && next_uppercase))) {
        word_ends.push_back(it - 1);
      }
      prev_uppercase = next_uppercase;
      prev_alphanumeric = next_alphanumeric;
    }
    if (prev_alphanumeric) {
      word_ends.push_back(last - 1);
    }
    return word_ends;
  }